

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void joystick_callback(wchar_t jid,wchar_t event)

{
  uint uVar1;
  char *pcVar2;
  double dVar3;
  wchar_t hatCount;
  wchar_t buttonCount;
  wchar_t axisCount;
  int local_34;
  uint local_30;
  uint local_2c;
  
  uVar1 = counter;
  if (event == L'\x00040001') {
    glfwGetJoystickAxes(jid,(int *)&local_2c);
    glfwGetJoystickButtons(jid,(int *)&local_30);
    glfwGetJoystickHats(jid,&local_34);
    uVar1 = counter;
    counter = counter + 1;
    dVar3 = glfwGetTime();
    pcVar2 = glfwGetJoystickName(jid);
    printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
           dVar3,(ulong)uVar1,jid,pcVar2,(ulong)local_2c,(ulong)local_30,local_34);
    return;
  }
  counter = counter + 1;
  glfwGetTime();
  printf("%08x at %0.3f: Joystick %i was disconnected\n",(ulong)uVar1,jid);
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axisCount, buttonCount, hatCount;

        glfwGetJoystickAxes(jid, &axisCount);
        glfwGetJoystickButtons(jid, &buttonCount);
        glfwGetJoystickHats(jid, &hatCount);

        printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
               counter++, glfwGetTime(),
               jid,
               glfwGetJoystickName(jid),
               axisCount,
               buttonCount,
               hatCount);
    }
    else
    {
        printf("%08x at %0.3f: Joystick %i was disconnected\n",
               counter++, glfwGetTime(), jid);
    }
}